

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

void __thiscall lzham::symbol_codec::start_arith_decoding(symbol_codec *this)

{
  uint uVar1;
  
  this->m_arith_value = 0;
  this->m_arith_length = 0xffffffff;
  uVar1 = get_bits(this,8);
  this->m_arith_value = uVar1 << 0x18;
  uVar1 = get_bits(this,8);
  this->m_arith_value = this->m_arith_value | uVar1 << 0x10;
  uVar1 = get_bits(this,8);
  this->m_arith_value = this->m_arith_value | uVar1 << 8;
  uVar1 = get_bits(this,8);
  this->m_arith_value = this->m_arith_value | uVar1;
  return;
}

Assistant:

void symbol_codec::start_arith_decoding()
   {
      LZHAM_ASSERT(m_mode == cDecoding);

      m_arith_length = cSymbolCodecArithMaxLen;
      m_arith_value = 0;

      m_arith_value = (get_bits(8) << 24);
      m_arith_value |= (get_bits(8) << 16);
      m_arith_value |= (get_bits(8) << 8);
      m_arith_value |= get_bits(8);
   }